

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O3

void __thiscall
FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>::~OPTPFor
          (OPTPFor<4U,_FastPForLib::Simple16<false>_> *this)

{
  pointer puVar1;
  
  (this->super_NewPFor<4U,_FastPForLib::Simple16<false>_>).super_IntegerCODEC._vptr_IntegerCODEC =
       (_func_int **)&PTR_encodeArray_001c32f0;
  puVar1 = (this->super_NewPFor<4U,_FastPForLib::Simple16<false>_>).tobecoded.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->super_NewPFor<4U,_FastPForLib::Simple16<false>_>).exceptions.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->super_NewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsValues.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->super_NewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

OPTPFor() {}